

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O3

void DepParserTask::add_all_features
               (example *ex,example *src,uchar tgt_ns,uint64_t mask,uint64_t multiplier,
               uint64_t offset,bool param_7)

{
  byte *pbVar1;
  ulong *puVar2;
  ulong uVar3;
  byte *pbVar4;
  undefined7 in_register_00000011;
  ulong *puVar5;
  
  pbVar4 = (src->super_example_predict).indices._begin;
  pbVar1 = (src->super_example_predict).indices._end;
  if (pbVar4 != pbVar1) {
    do {
      uVar3 = (ulong)*pbVar4;
      if (uVar3 != 0x80) {
        puVar2 = (src->super_example_predict).feature_space[uVar3].indicies._end;
        for (puVar5 = (src->super_example_predict).feature_space[uVar3].indicies._begin;
            puVar5 != puVar2; puVar5 = puVar5 + 1) {
          features::push_back((ex->super_example_predict).feature_space +
                              (CONCAT71(in_register_00000011,tgt_ns) & 0xffffffff),1.0,
                              (*puVar5 / multiplier + offset) * multiplier & mask);
        }
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  return;
}

Assistant:

void add_all_features(example &ex, example &src, unsigned char tgt_ns, uint64_t mask, uint64_t multiplier,
    uint64_t offset, bool /* audit */ = false)
{
  features &tgt_fs = ex.feature_space[tgt_ns];
  for (namespace_index ns : src.indices)
    if (ns != constant_namespace)  // ignore constant_namespace
      for (feature_index i : src.feature_space[ns].indicies)
        tgt_fs.push_back(1.0f, ((i / multiplier + offset) * multiplier) & mask);
}